

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.hpp
# Opt level: O0

void __thiscall ECF::ECF(ECF *this,string *filename,bool auto_split)

{
  char *__s;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  string *psStack_18;
  bool auto_split_local;
  string *filename_local;
  ECF *this_local;
  
  local_19 = auto_split;
  psStack_18 = filename;
  filename_local = (string *)this;
  std::vector<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>::vector(&this->data);
  std::vector<Pub_File,_std::allocator<Pub_File>_>::vector(&this->files);
  __s = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  Read(this,&local_40,(bool)(local_19 & 1));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

ECF(const std::string& filename, bool auto_split) { Read(filename.c_str(), auto_split); }